

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O0

void __thiscall
pbrt::CameraSceneEntity::CameraSceneEntity
          (CameraSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          CameraTransform *cameraTransform,string *medium)

{
  FileLoc loc_00;
  void *in_RCX;
  ParameterDictionary *in_RDX;
  SceneEntity *in_RDI;
  string *in_R8;
  ParameterDictionary *in_stack_ffffffffffffff08;
  string *name_00;
  undefined1 *puVar1;
  undefined1 in_stack_ffffffffffffff38 [16];
  undefined1 local_98 [112];
  string *local_28;
  void *local_20;
  
  name_00 = (string *)&stack0x00000008;
  puVar1 = local_98;
  local_28 = in_R8;
  local_20 = in_RCX;
  ParameterDictionary::ParameterDictionary(in_RDX,in_stack_ffffffffffffff08);
  loc_00.filename._M_str = (char *)in_stack_ffffffffffffff38._0_8_;
  loc_00.line = in_stack_ffffffffffffff38._8_4_;
  loc_00.column = in_stack_ffffffffffffff38._12_4_;
  loc_00.filename._M_len = (size_t)puVar1;
  SceneEntity::SceneEntity(in_RDI,name_00,in_RDX,loc_00);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x859900);
  memcpy(in_RDI + 1,local_20,0x338);
  std::__cxx11::string::string
            ((string *)((long)&in_RDI[6].parameters.params.field_2 + 0x38),local_28);
  return;
}

Assistant:

CameraSceneEntity(const std::string &name, ParameterDictionary parameters,
                      FileLoc loc, const CameraTransform &cameraTransform,
                      const std::string &medium)
        : SceneEntity(name, parameters, loc),
          cameraTransform(cameraTransform),
          medium(medium) {}